

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

void __thiscall fmp4_stream::trun::trun(trun *this)

{
  trun *this_local;
  
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_0026cc88;
  std::vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>::
  vector(&this->m_sentry);
  zero_set(this);
  std::__cxx11::string::operator=((string *)&(this->super_full_box).super_box.box_type_,"trun");
  return;
}

Assistant:

trun() : full_box() 
		{
			zero_set();
			this->box_type_ = "trun"; 
		}